

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

boolean levl_follower(monst *mtmp)

{
  boolean bVar1;
  int iVar2;
  
  iVar2 = mon_has_amulet(mtmp);
  if (iVar2 == 0) {
    if (mtmp->mtame != '\0') {
      return '\x01';
    }
    if ((mtmp->field_0x63 & 0x20) != 0) {
      return '\x01';
    }
    bVar1 = is_fshk(mtmp);
    if (bVar1 != '\0') {
      return '\x01';
    }
    if ((mtmp->data->mflags2 & 0x1000000) != 0) {
      return (mtmp->field_0x62 & 1) == 0 | u.uhave._0_1_ & 1;
    }
  }
  return '\0';
}

Assistant:

boolean levl_follower(struct monst *mtmp)
{
	/* monsters with the Amulet--even pets--won't follow across levels */
	if (mon_has_amulet(mtmp)) return FALSE;

	/* some monsters will follow even while intending to flee from you */
	if (mtmp->mtame || mtmp->iswiz || is_fshk(mtmp)) return TRUE;

	/* stalking types follow, but won't when fleeing unless you hold
	   the Amulet */
	return (boolean)((mtmp->data->mflags2 & M2_STALK) &&
				(!mtmp->mflee || u.uhave.amulet));
}